

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_FCMLA_zzxz(DisasContext_conflict1 *s,arg_FCMLA_zzxz *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  TCGv_ptr ptr;
  TCGv_ptr status;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_FCMLA_zzxz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = vec_full_reg_size(s);
    ptr = get_fpstatus_ptr_aarch64(tcg_ctx_00,a->esz == 1);
    dofs = vec_full_reg_offset(s,a->rd);
    aofs = vec_full_reg_offset(s,a->rn);
    bofs = vec_full_reg_offset(s,a->rm);
    tcg_gen_gvec_3_ptr_aarch64
              (tcg_ctx_00,dofs,aofs,bofs,ptr,oprsz,oprsz,a->index * 4 + a->rot,
               trans_FCMLA_zzxz::fns[a->esz + -1]);
    tcg_temp_free_ptr(tcg_ctx_00,ptr);
  }
  return true;
}

Assistant:

static bool trans_FCMLA_zzxz(DisasContext *s, arg_FCMLA_zzxz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    static gen_helper_gvec_3_ptr * const fns[2] = {
        gen_helper_gvec_fcmlah_idx,
        gen_helper_gvec_fcmlas_idx,
    };

    tcg_debug_assert(a->esz == 1 || a->esz == 2);
    tcg_debug_assert(a->rd == a->ra);
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);
        tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           status, vsz, vsz,
                           a->index * 4 + a->rot,
                           fns[a->esz - 1]);
        tcg_temp_free_ptr(tcg_ctx, status);
    }
    return true;
}